

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> __thiscall
fmt::v8::detail::write<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,
          basic_string_view<wchar_t> s,basic_format_specs<wchar_t> *specs,locale_ref param_4)

{
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar1;
  error_handler local_21;
  
  check_string_type_spec<fmt::v8::detail::error_handler>
            (*(presentation_type *)(s.size_ + 8),&local_21);
  bVar1 = write<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                    (this,out,s,specs);
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out,
                         basic_string_view<type_identity_t<Char>> s,
                         const basic_format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  check_string_type_spec(specs.type);
  return write(out, s, specs);
}